

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CEExecOptions.h
# Opt level: O0

void __thiscall CEExecOptions::~CEExecOptions(CEExecOptions *this)

{
  CEExecOptions *in_RDI;
  
  ~CEExecOptions(in_RDI);
  operator_delete(in_RDI);
  return;
}

Assistant:

virtual ~CEExecOptions() {}